

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__usertype
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  bool bVar2;
  long *plVar3;
  StringHash SVar4;
  long *plVar5;
  xmlChar *text;
  
  plVar3 = (long *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  *plVar3 = 0;
  plVar3[1] = 0;
  *attributeDataPtr = plVar3;
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text = *ppxVar1, text != (xmlChar *)0x0)) {
    do {
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      plVar5 = plVar3;
      if ((SVar4 == 0x74835) || (plVar5 = plVar3 + 1, SVar4 == 0x7a6c895)) {
        *plVar5 = (long)ppxVar1[1];
      }
      else {
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x9c9c7a5,text,ppxVar1[1]);
        if (bVar2) {
          return false;
        }
      }
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text != (xmlChar *)0x0);
  }
  if ((*plVar3 == 0) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x9c9c7a5,0x74835,(ParserChar *)0x0),
     bVar2)) {
    return false;
  }
  if ((plVar3[1] == 0) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x9c9c7a5,0x7a6c895,(ParserChar *)0x0),
     bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__usertype( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__usertype( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

usertype__AttributeData* attributeData = newData<usertype__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_name:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_source:
    {

attributeData->source = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->source, strlen(attributeData->source));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_USERTYPE,
            HASH_ATTRIBUTE_source,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_USERTYPE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( !attributeData->name )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_USERTYPE, HASH_ATTRIBUTE_name, 0 ) )
        return false;
}
if ( !attributeData->source )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_USERTYPE, HASH_ATTRIBUTE_source, 0 ) )
        return false;
}


    return true;
}